

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

OpenApiVersion
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetOpenApiVersion(ValueType *document)

{
  bool bVar1;
  SizeType SVar2;
  uint uVar3;
  ConstMemberIterator CVar4;
  Ch *pCVar5;
  Ch *pCVar6;
  Pointer pVVar7;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *rhs
  ;
  OpenApiVersion OVar8;
  ValueType kVersion31Value;
  ValueType kVersion30Value;
  ValueType kVersion20Value;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Pointer local_58;
  undefined8 uStack_50;
  Data local_48;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_30;
  
  if (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
      ::
      GetOpenApiVersion(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&)
      ::len == '\0') {
    GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::GetOpenApiVersion();
  }
  OVar8 = kVersionNone;
  if ((document->data_).f.flags == 3) {
    internal::
    Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
    ::GetSwaggerString();
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&local_58,document);
    pVVar7 = local_58;
    CVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(document);
    if (pVVar7 == CVar4.ptr_) {
      internal::
      Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
      ::GetOpenApiString();
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&local_58,document);
      pVVar7 = local_58;
    }
    CVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(document);
    OVar8 = kVersionNone;
    if ((pVVar7 != CVar4.ptr_) &&
       (OVar8 = kVersionUnknown,
       (undefined1  [16])
       ((undefined1  [16])(pVVar7->value).data_ & (undefined1  [16])0x400000000000000) !=
       (undefined1  [16])0x0)) {
      rhs = &pVVar7->value;
      uStack_50 = 0x40500000013ce25;
      local_58 = (Pointer)0x3;
      bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)&local_58,rhs);
      OVar8 = kVersion20;
      if (!bVar1) {
        uStack_60 = 0x40500000013ce29;
        local_68 = 4;
        SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetStringLength(rhs);
        if (GetOpenApiVersion::len < SVar2) {
          pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(rhs);
          local_48.n = (Number)0x0;
          local_48.s.str = (Ch *)0x0;
          if (GetOpenApiVersion::len != 0 && pCVar5 == (Ch *)0x0) {
            __assert_fail("str != 0 || len == 0u",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                          ,0x19c,
                          "rapidjson::GenericStringRef<char>::GenericStringRef(const CharType *, SizeType) [CharType = char]"
                         );
          }
          pCVar6 = "";
          if (pCVar5 != (Ch *)0x0) {
            pCVar6 = pCVar5;
          }
          local_48.s.str = (Ch *)((ulong)pCVar6 | 0x405000000000000);
          local_48.s.hashcode = 0;
          local_48.s.length = GetOpenApiVersion::len;
          bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                *)&local_68,
                               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)&local_48.s);
        }
        else {
          bVar1 = false;
        }
        OVar8 = kVersion30;
        if (bVar1 == false) {
          uStack_70 = 0x40500000013ce2e;
          local_78 = 4;
          SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetStringLength(rhs);
          if (GetOpenApiVersion::len < SVar2) {
            pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetString(rhs);
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GenericValue(&local_30,pCVar5,GetOpenApiVersion::len);
            bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)&local_78,&local_30);
            uVar3 = (uint)bVar1;
          }
          else {
            uVar3 = 0;
          }
          OVar8 = uVar3 + kVersionUnknown | kVersion31;
        }
      }
    }
  }
  return OVar8;
}

Assistant:

static OpenApiVersion GetOpenApiVersion(const ValueType& document) {
        static const Ch kVersion20String[] = { '2', '.', '0', '\0' };
        static const Ch kVersion30String[] = { '3', '.', '0', '.', '\0' }; // ignore patch level
        static const Ch kVersion31String[] = { '3', '.', '1', '.', '\0' }; // ignore patch level
        static SizeType len = internal::StrLen<Ch>(kVersion30String);

        if (!document.IsObject()) {
            return kVersionNone;
        }

        // Get the open api version from the swagger / openapi keyword at the supplied location
        typename ValueType::ConstMemberIterator itr = document.FindMember(SchemaType::GetSwaggerString());
        if (itr == document.MemberEnd()) itr = document.FindMember(SchemaType::GetOpenApiString());
        if (itr != document.MemberEnd()) {
            if (!itr->value.IsString()) return kVersionUnknown;
            const ValueType kVersion20Value(kVersion20String);
            if (kVersion20Value == itr->value) return kVersion20; // must match 2.0 exactly
            const ValueType kVersion30Value(kVersion30String);
            if (itr->value.GetStringLength() > len && kVersion30Value == ValueType(itr->value.GetString(), len)) return kVersion30; // must match 3.0.x
            const ValueType kVersion31Value(kVersion31String);
            if (itr->value.GetStringLength() > len && kVersion31Value == ValueType(itr->value.GetString(), len)) return kVersion31; // must match 3.1.x
            return kVersionUnknown;
        }
        // swagger or openapi not found
        return kVersionNone;
    }